

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<4,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Geometry *pGVar3;
  RTCIntersectArguments *pRVar4;
  RTCRayQueryContext *pRVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 (*pauVar22) [16];
  byte bVar23;
  int iVar24;
  AABBNodeMB4D *node1;
  ulong uVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  uint uVar29;
  float *vertices;
  ulong uVar30;
  ulong uVar31;
  ulong in_R8;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [16];
  undefined4 uVar77;
  undefined1 auVar78 [16];
  float fVar79;
  float fVar81;
  float fVar82;
  undefined1 auVar80 [16];
  float fVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 in_ZMM27 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_1174;
  Scene *local_1170;
  long local_1168;
  long local_1160;
  long local_1158;
  long local_1150;
  long local_1148;
  long local_1140;
  undefined1 (*local_1138) [16];
  long local_1130;
  RTCFilterFunctionNArguments local_1128;
  float local_10f8;
  undefined4 local_10f4;
  undefined4 local_10f0;
  float local_10ec;
  float local_10e8;
  undefined4 local_10e4;
  uint local_10e0;
  uint local_10dc;
  uint local_10d8;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  byte local_1077;
  float local_1068 [4];
  float local_1058 [4];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
      auVar44 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
      auVar92 = ZEXT1664(auVar44);
      auVar45 = vmaxss_avx512f(auVar44,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar46 = vmaxss_avx512f(auVar44,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar47._8_4_ = 0x7fffffff;
      auVar47._0_8_ = 0x7fffffff7fffffff;
      auVar47._12_4_ = 0x7fffffff;
      auVar47 = vandps_avx512vl((undefined1  [16])aVar2,auVar47);
      auVar57._8_4_ = 0x219392ef;
      auVar57._0_8_ = 0x219392ef219392ef;
      auVar57._12_4_ = 0x219392ef;
      uVar33 = vcmpps_avx512vl(auVar47,auVar57,1);
      bVar6 = (bool)((byte)uVar33 & 1);
      auVar68._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * (int)aVar2.x;
      bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar68._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * (int)aVar2.y;
      bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar68._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * (int)aVar2.z;
      bVar6 = (bool)((byte)(uVar33 >> 3) & 1);
      auVar68._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * aVar2.field_3.a;
      auVar47 = vrcp14ps_avx512vl(auVar68);
      auVar48._8_4_ = 0x3f800000;
      auVar48._0_8_ = &DAT_3f8000003f800000;
      auVar48._12_4_ = 0x3f800000;
      auVar48 = vfnmadd213ps_avx512vl(auVar68,auVar47,auVar48);
      local_1138 = (undefined1 (*) [16])local_f68;
      vfmadd132ps_fma(auVar48,auVar47,auVar47);
      auVar47 = vucomiss_avx512f(auVar44);
      auVar48 = vbroadcastss_avx512vl(auVar47);
      auVar93 = ZEXT1664(auVar48);
      vmovshdup_avx(auVar47);
      auVar48 = vshufps_avx512vl(auVar47,auVar47,0x55);
      auVar94 = ZEXT1664(auVar48);
      vshufpd_avx(auVar47,auVar47,1);
      auVar48 = vshufps_avx512vl(auVar47,auVar47,0xaa);
      auVar95 = ZEXT1664(auVar48);
      auVar55._0_4_ = auVar47._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
      auVar55._4_4_ = auVar47._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
      auVar55._8_4_ = auVar47._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
      auVar55._12_4_ = auVar47._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
      auVar47 = vshufps_avx(auVar55,auVar55,0x55);
      auVar48 = vshufps_avx(auVar55,auVar55,0xaa);
      vucomiss_avx512f(auVar44);
      vucomiss_avx512f(auVar44);
      auVar44 = vbroadcastss_avx512vl(auVar45);
      auVar96 = ZEXT1664(auVar44);
      uVar77 = auVar46._0_4_;
      auVar75 = ZEXT1664(CONCAT412(uVar77,CONCAT48(uVar77,CONCAT44(uVar77,uVar77))));
      uVar33 = CONCAT44(auVar55._0_4_,auVar55._0_4_);
      local_f98._0_8_ = uVar33 ^ 0x8000000080000000;
      local_f98._8_4_ = -auVar55._0_4_;
      local_f98._12_4_ = -auVar55._0_4_;
      auVar86 = ZEXT1664(local_f98);
      local_fa8._0_8_ = auVar47._0_8_ ^ 0x8000000080000000;
      local_fa8._8_4_ = auVar47._8_4_ ^ 0x80000000;
      local_fa8._12_4_ = auVar47._12_4_ ^ 0x80000000;
      auVar88 = ZEXT1664(local_fa8);
      local_fb8._0_8_ = auVar48._0_8_ ^ 0x8000000080000000;
      local_fb8._8_4_ = auVar48._8_4_ ^ 0x80000000;
      local_fb8._12_4_ = auVar48._12_4_ ^ 0x80000000;
      auVar89 = ZEXT1664(local_fb8);
      local_1140 = 0;
      local_1148 = 0x20;
      local_1150 = 0x40;
      local_1158 = 0x10;
      local_1160 = 0x30;
      local_1168 = 0x50;
      lVar27 = 0x20;
      lVar36 = 0;
      lVar38 = 0x30;
      lVar26 = 0x50;
      lVar40 = 0x40;
      lVar42 = 0x10;
      do {
        do {
          do {
            if (local_1138 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar22 = local_1138 + -1;
            local_1138 = local_1138 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar22 + 8));
          uVar33 = *(ulong *)*local_1138;
          do {
            if ((uVar33 & 8) == 0) {
              uVar25 = uVar33 & 0xfffffffffffffff0;
              uVar77 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
              auVar45._4_4_ = uVar77;
              auVar45._0_4_ = uVar77;
              auVar45._8_4_ = uVar77;
              auVar45._12_4_ = uVar77;
              auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + lVar36),auVar45,
                                        *(undefined1 (*) [16])(uVar25 + 0x20 + lVar36));
              auVar48 = vfmadd213ps_avx512vl(auVar47,auVar93._0_16_,auVar86._0_16_);
              auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + lVar27),auVar45,
                                        *(undefined1 (*) [16])(uVar25 + 0x20 + lVar27));
              auVar44 = vmaxps_avx512vl(auVar96._0_16_,auVar48);
              auVar48 = vfmadd213ps_avx512vl(auVar47,auVar94._0_16_,auVar88._0_16_);
              auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + lVar40),auVar45,
                                        *(undefined1 (*) [16])(uVar25 + 0x20 + lVar40));
              auVar47 = vfmadd213ps_avx512vl(auVar47,auVar95._0_16_,auVar89._0_16_);
              auVar47 = vmaxps_avx(auVar48,auVar47);
              auVar48 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + lVar42),auVar45,
                                        *(undefined1 (*) [16])(uVar25 + 0x20 + lVar42));
              local_10b8 = vmaxps_avx(auVar44,auVar47);
              auVar48 = vfmadd213ps_avx512vl(auVar48,auVar93._0_16_,auVar86._0_16_);
              auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + lVar38),auVar45,
                                        *(undefined1 (*) [16])(uVar25 + 0x20 + lVar38));
              auVar44 = vfmadd213ps_avx512vl(auVar47,auVar94._0_16_,auVar88._0_16_);
              auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + lVar26),auVar45,
                                        *(undefined1 (*) [16])(uVar25 + 0x20 + lVar26));
              auVar47 = vfmadd213ps_avx512vl(auVar47,auVar95._0_16_,auVar89._0_16_);
              auVar47 = vminps_avx(auVar44,auVar47);
              auVar48 = vminps_avx(auVar75._0_16_,auVar48);
              auVar47 = vminps_avx(auVar48,auVar47);
              uVar9 = vcmpps_avx512vl(local_10b8,auVar47,2);
              bVar23 = (byte)uVar9;
              if (((uint)uVar33 & 7) == 6) {
                uVar9 = vcmpps_avx512vl(auVar45,*(undefined1 (*) [16])(uVar25 + 0xf0),1);
                uVar10 = vcmpps_avx512vl(auVar45,*(undefined1 (*) [16])(uVar25 + 0xe0),0xd);
                bVar23 = (byte)uVar9 & (byte)uVar10 & bVar23;
              }
              in_R8 = CONCAT44((int)(in_R8 >> 0x20),(uint)bVar23);
            }
            if ((uVar33 & 8) == 0) {
              if (in_R8 == 0) {
                iVar24 = 4;
              }
              else {
                uVar25 = uVar33 & 0xfffffffffffffff0;
                lVar14 = 0;
                for (uVar33 = in_R8; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                  lVar14 = lVar14 + 1;
                }
                iVar24 = 0;
                uVar30 = in_R8 - 1 & in_R8;
                uVar33 = *(ulong *)(uVar25 + lVar14 * 8);
                if (uVar30 != 0) {
                  uVar29 = *(uint *)(local_10b8 + lVar14 * 4);
                  lVar14 = 0;
                  for (uVar28 = uVar30; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000
                      ) {
                    lVar14 = lVar14 + 1;
                  }
                  uVar30 = uVar30 - 1 & uVar30;
                  uVar28 = *(ulong *)(uVar25 + lVar14 * 8);
                  uVar13 = *(uint *)(local_10b8 + lVar14 * 4);
                  if (uVar30 == 0) {
                    if (uVar29 < uVar13) {
                      *(ulong *)*local_1138 = uVar28;
                      *(uint *)((long)*local_1138 + 8) = uVar13;
                      local_1138 = local_1138 + 1;
                    }
                    else {
                      *(ulong *)*local_1138 = uVar33;
                      *(uint *)((long)*local_1138 + 8) = uVar29;
                      uVar33 = uVar28;
                      local_1138 = local_1138 + 1;
                    }
                  }
                  else {
                    auVar44._8_8_ = 0;
                    auVar44._0_8_ = uVar33;
                    auVar47 = vpunpcklqdq_avx(auVar44,ZEXT416(uVar29));
                    auVar46._8_8_ = 0;
                    auVar46._0_8_ = uVar28;
                    auVar48 = vpunpcklqdq_avx(auVar46,ZEXT416(uVar13));
                    lVar14 = 0;
                    for (uVar33 = uVar30; (uVar33 & 1) == 0;
                        uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                      lVar14 = lVar14 + 1;
                    }
                    uVar30 = uVar30 - 1 & uVar30;
                    auVar66._8_8_ = 0;
                    auVar66._0_8_ = *(ulong *)(uVar25 + lVar14 * 8);
                    auVar68 = vpunpcklqdq_avx(auVar66,ZEXT416(*(uint *)(local_10b8 + lVar14 * 4)));
                    auVar44 = vpshufd_avx(auVar47,0xaa);
                    auVar45 = vpshufd_avx(auVar48,0xaa);
                    auVar46 = vpshufd_avx(auVar68,0xaa);
                    if (uVar30 == 0) {
                      uVar33 = vpcmpgtd_avx512vl(auVar45,auVar44);
                      uVar33 = uVar33 & 0xf;
                      auVar45 = vpblendmd_avx512vl(auVar48,auVar47);
                      bVar6 = (bool)((byte)uVar33 & 1);
                      auVar49._0_4_ = (uint)bVar6 * auVar45._0_4_ | (uint)!bVar6 * auVar44._0_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
                      auVar49._4_4_ = (uint)bVar6 * auVar45._4_4_ | (uint)!bVar6 * auVar44._4_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
                      auVar49._8_4_ = (uint)bVar6 * auVar45._8_4_ | (uint)!bVar6 * auVar44._8_4_;
                      bVar6 = SUB81(uVar33 >> 3,0);
                      auVar49._12_4_ = (uint)bVar6 * auVar45._12_4_ | (uint)!bVar6 * auVar44._12_4_;
                      auVar48 = vmovdqa32_avx512vl(auVar48);
                      bVar6 = (bool)((byte)uVar33 & 1);
                      auVar50._0_4_ = (uint)bVar6 * auVar48._0_4_ | (uint)!bVar6 * auVar47._0_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
                      auVar50._4_4_ = (uint)bVar6 * auVar48._4_4_ | (uint)!bVar6 * auVar47._4_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
                      auVar50._8_4_ = (uint)bVar6 * auVar48._8_4_ | (uint)!bVar6 * auVar47._8_4_;
                      bVar6 = SUB81(uVar33 >> 3,0);
                      auVar50._12_4_ = (uint)bVar6 * auVar48._12_4_ | (uint)!bVar6 * auVar47._12_4_;
                      auVar47 = vpshufd_avx(auVar49,0xaa);
                      uVar25 = vpcmpgtd_avx512vl(auVar46,auVar47);
                      uVar25 = uVar25 & 0xf;
                      auVar48 = vpblendmd_avx512vl(auVar68,auVar49);
                      bVar6 = (bool)((byte)uVar25 & 1);
                      bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
                      uVar33 = CONCAT44((uint)bVar7 * auVar48._4_4_ | (uint)!bVar7 * auVar47._4_4_,
                                        (uint)bVar6 * auVar48._0_4_ | (uint)!bVar6 * auVar47._0_4_);
                      auVar47 = vmovdqa32_avx512vl(auVar68);
                      bVar6 = (bool)((byte)uVar25 & 1);
                      auVar51._0_4_ = (uint)bVar6 * auVar47._0_4_ | !bVar6 * auVar49._0_4_;
                      bVar6 = (bool)((byte)(uVar25 >> 1) & 1);
                      auVar51._4_4_ = (uint)bVar6 * auVar47._4_4_ | !bVar6 * auVar49._4_4_;
                      bVar6 = (bool)((byte)(uVar25 >> 2) & 1);
                      auVar51._8_4_ = (uint)bVar6 * auVar47._8_4_ | !bVar6 * auVar49._8_4_;
                      bVar6 = SUB81(uVar25 >> 3,0);
                      auVar51._12_4_ = (uint)bVar6 * auVar47._12_4_ | !bVar6 * auVar49._12_4_;
                      auVar47 = vpshufd_avx(auVar51,0xaa);
                      auVar48 = vpshufd_avx(auVar50,0xaa);
                      uVar25 = vpcmpgtd_avx512vl(auVar47,auVar48);
                      uVar25 = uVar25 & 0xf;
                      auVar48 = vpblendmd_avx512vl(auVar51,auVar50);
                      bVar6 = (bool)((byte)uVar25 & 1);
                      auVar52._0_4_ = (uint)bVar6 * auVar48._0_4_ | (uint)!bVar6 * auVar47._0_4_;
                      bVar6 = (bool)((byte)(uVar25 >> 1) & 1);
                      auVar52._4_4_ = (uint)bVar6 * auVar48._4_4_ | (uint)!bVar6 * auVar47._4_4_;
                      bVar6 = (bool)((byte)(uVar25 >> 2) & 1);
                      auVar52._8_4_ = (uint)bVar6 * auVar48._8_4_ | (uint)!bVar6 * auVar47._8_4_;
                      bVar6 = SUB81(uVar25 >> 3,0);
                      auVar52._12_4_ = (uint)bVar6 * auVar48._12_4_ | (uint)!bVar6 * auVar47._12_4_;
                      auVar47 = vmovdqa32_avx512vl(auVar51);
                      bVar6 = (bool)((byte)uVar25 & 1);
                      auVar53._0_4_ = (uint)bVar6 * auVar47._0_4_ | !bVar6 * auVar50._0_4_;
                      bVar6 = (bool)((byte)(uVar25 >> 1) & 1);
                      auVar53._4_4_ = (uint)bVar6 * auVar47._4_4_ | !bVar6 * auVar50._4_4_;
                      bVar6 = (bool)((byte)(uVar25 >> 2) & 1);
                      auVar53._8_4_ = (uint)bVar6 * auVar47._8_4_ | !bVar6 * auVar50._8_4_;
                      bVar6 = SUB81(uVar25 >> 3,0);
                      auVar53._12_4_ = (uint)bVar6 * auVar47._12_4_ | !bVar6 * auVar50._12_4_;
                      *local_1138 = auVar53;
                      local_1138[1] = auVar52;
                      local_1138 = local_1138 + 2;
                    }
                    else {
                      lVar14 = 0;
                      for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                        lVar14 = lVar14 + 1;
                      }
                      uVar29 = *(uint *)(local_10b8 + lVar14 * 4);
                      auVar85._8_8_ = 0;
                      auVar85._0_8_ = *(ulong *)(uVar25 + lVar14 * 8);
                      auVar55 = vpunpcklqdq_avx(auVar85,ZEXT416(uVar29));
                      uVar33 = vpcmpgtd_avx512vl(auVar45,auVar44);
                      uVar33 = uVar33 & 0xf;
                      auVar45 = vpblendmd_avx512vl(auVar48,auVar47);
                      bVar6 = (bool)((byte)uVar33 & 1);
                      auVar67._0_4_ = (uint)bVar6 * auVar45._0_4_ | (uint)!bVar6 * auVar44._0_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
                      auVar67._4_4_ = (uint)bVar6 * auVar45._4_4_ | (uint)!bVar6 * auVar44._4_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
                      auVar67._8_4_ = (uint)bVar6 * auVar45._8_4_ | (uint)!bVar6 * auVar44._8_4_;
                      bVar6 = SUB81(uVar33 >> 3,0);
                      auVar67._12_4_ = (uint)bVar6 * auVar45._12_4_ | (uint)!bVar6 * auVar44._12_4_;
                      auVar48 = vmovdqa32_avx512vl(auVar48);
                      bVar6 = (bool)((byte)uVar33 & 1);
                      auVar65._0_4_ = (uint)bVar6 * auVar48._0_4_ | (uint)!bVar6 * auVar47._0_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
                      auVar65._4_4_ = (uint)bVar6 * auVar48._4_4_ | (uint)!bVar6 * auVar47._4_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
                      auVar65._8_4_ = (uint)bVar6 * auVar48._8_4_ | (uint)!bVar6 * auVar47._8_4_;
                      bVar6 = SUB81(uVar33 >> 3,0);
                      auVar65._12_4_ = (uint)bVar6 * auVar48._12_4_ | (uint)!bVar6 * auVar47._12_4_;
                      auVar64._4_4_ = uVar29;
                      auVar64._0_4_ = uVar29;
                      auVar64._8_4_ = uVar29;
                      auVar64._12_4_ = uVar29;
                      uVar33 = vpcmpgtd_avx512vl(auVar64,auVar46);
                      uVar33 = uVar33 & 0xf;
                      auVar47 = vpblendmd_avx512vl(auVar55,auVar68);
                      bVar6 = (bool)((byte)uVar33 & 1);
                      auVar56._0_4_ = (uint)bVar6 * auVar47._0_4_ | !bVar6 * uVar29;
                      bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
                      auVar56._4_4_ = (uint)bVar6 * auVar47._4_4_ | !bVar6 * uVar29;
                      bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
                      auVar56._8_4_ = (uint)bVar6 * auVar47._8_4_ | !bVar6 * uVar29;
                      bVar6 = SUB81(uVar33 >> 3,0);
                      auVar56._12_4_ = (uint)bVar6 * auVar47._12_4_ | !bVar6 * uVar29;
                      auVar47 = vmovdqa32_avx512vl(auVar55);
                      bVar6 = (bool)((byte)uVar33 & 1);
                      auVar58._0_4_ = (uint)bVar6 * auVar47._0_4_ | (uint)!bVar6 * auVar68._0_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
                      auVar58._4_4_ = (uint)bVar6 * auVar47._4_4_ | (uint)!bVar6 * auVar68._4_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
                      auVar58._8_4_ = (uint)bVar6 * auVar47._8_4_ | (uint)!bVar6 * auVar68._8_4_;
                      bVar6 = SUB81(uVar33 >> 3,0);
                      auVar58._12_4_ = (uint)bVar6 * auVar47._12_4_ | (uint)!bVar6 * auVar68._12_4_;
                      auVar47 = vpshufd_avx(auVar58,0xaa);
                      auVar48 = vpshufd_avx(auVar65,0xaa);
                      uVar33 = vpcmpgtd_avx512vl(auVar47,auVar48);
                      uVar33 = uVar33 & 0xf;
                      auVar48 = vpblendmd_avx512vl(auVar58,auVar65);
                      bVar6 = (bool)((byte)uVar33 & 1);
                      auVar59._0_4_ = (uint)bVar6 * auVar48._0_4_ | (uint)!bVar6 * auVar47._0_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
                      auVar59._4_4_ = (uint)bVar6 * auVar48._4_4_ | (uint)!bVar6 * auVar47._4_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
                      auVar59._8_4_ = (uint)bVar6 * auVar48._8_4_ | (uint)!bVar6 * auVar47._8_4_;
                      bVar6 = SUB81(uVar33 >> 3,0);
                      auVar59._12_4_ = (uint)bVar6 * auVar48._12_4_ | (uint)!bVar6 * auVar47._12_4_;
                      auVar47 = vmovdqa32_avx512vl(auVar58);
                      bVar6 = (bool)((byte)uVar33 & 1);
                      auVar62._0_4_ = (uint)bVar6 * auVar47._0_4_ | !bVar6 * auVar65._0_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
                      auVar62._4_4_ = (uint)bVar6 * auVar47._4_4_ | !bVar6 * auVar65._4_4_;
                      bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
                      auVar62._8_4_ = (uint)bVar6 * auVar47._8_4_ | !bVar6 * auVar65._8_4_;
                      bVar6 = SUB81(uVar33 >> 3,0);
                      auVar62._12_4_ = (uint)bVar6 * auVar47._12_4_ | !bVar6 * auVar65._12_4_;
                      auVar47 = vpshufd_avx(auVar56,0xaa);
                      auVar48 = vpshufd_avx(auVar67,0xaa);
                      uVar25 = vpcmpgtd_avx512vl(auVar47,auVar48);
                      uVar25 = uVar25 & 0xf;
                      auVar48 = vpblendmd_avx512vl(auVar56,auVar67);
                      bVar6 = (bool)((byte)uVar25 & 1);
                      bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
                      uVar33 = CONCAT44((uint)bVar7 * auVar48._4_4_ | (uint)!bVar7 * auVar47._4_4_,
                                        (uint)bVar6 * auVar48._0_4_ | (uint)!bVar6 * auVar47._0_4_);
                      auVar47 = vmovdqa32_avx512vl(auVar56);
                      bVar6 = (bool)((byte)uVar25 & 1);
                      auVar60._0_4_ = (uint)bVar6 * auVar47._0_4_ | !bVar6 * auVar67._0_4_;
                      bVar6 = (bool)((byte)(uVar25 >> 1) & 1);
                      auVar60._4_4_ = (uint)bVar6 * auVar47._4_4_ | !bVar6 * auVar67._4_4_;
                      bVar6 = (bool)((byte)(uVar25 >> 2) & 1);
                      auVar60._8_4_ = (uint)bVar6 * auVar47._8_4_ | !bVar6 * auVar67._8_4_;
                      bVar6 = SUB81(uVar25 >> 3,0);
                      auVar60._12_4_ = (uint)bVar6 * auVar47._12_4_ | !bVar6 * auVar67._12_4_;
                      auVar47 = vpshufd_avx(auVar60,0xaa);
                      auVar48 = vpshufd_avx(auVar59,0xaa);
                      uVar25 = vpcmpgtd_avx512vl(auVar48,auVar47);
                      uVar25 = uVar25 & 0xf;
                      auVar48 = vpblendmd_avx512vl(auVar59,auVar60);
                      bVar6 = (bool)((byte)uVar25 & 1);
                      auVar61._0_4_ = (uint)bVar6 * auVar48._0_4_ | (uint)!bVar6 * auVar47._0_4_;
                      bVar6 = (bool)((byte)(uVar25 >> 1) & 1);
                      auVar61._4_4_ = (uint)bVar6 * auVar48._4_4_ | (uint)!bVar6 * auVar47._4_4_;
                      bVar6 = (bool)((byte)(uVar25 >> 2) & 1);
                      auVar61._8_4_ = (uint)bVar6 * auVar48._8_4_ | (uint)!bVar6 * auVar47._8_4_;
                      bVar6 = SUB81(uVar25 >> 3,0);
                      auVar61._12_4_ = (uint)bVar6 * auVar48._12_4_ | (uint)!bVar6 * auVar47._12_4_;
                      auVar47 = vmovdqa32_avx512vl(auVar59);
                      bVar6 = (bool)((byte)uVar25 & 1);
                      auVar63._0_4_ = (uint)bVar6 * auVar47._0_4_ | !bVar6 * auVar60._0_4_;
                      bVar6 = (bool)((byte)(uVar25 >> 1) & 1);
                      auVar63._4_4_ = (uint)bVar6 * auVar47._4_4_ | !bVar6 * auVar60._4_4_;
                      bVar6 = (bool)((byte)(uVar25 >> 2) & 1);
                      auVar63._8_4_ = (uint)bVar6 * auVar47._8_4_ | !bVar6 * auVar60._8_4_;
                      bVar6 = SUB81(uVar25 >> 3,0);
                      auVar63._12_4_ = (uint)bVar6 * auVar47._12_4_ | !bVar6 * auVar60._12_4_;
                      *local_1138 = auVar62;
                      local_1138[1] = auVar63;
                      local_1138[2] = auVar61;
                      local_1138 = local_1138 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar24 = 6;
            }
          } while (iVar24 == 0);
        } while (iVar24 != 6);
        local_1130 = (ulong)((uint)uVar33 & 0xf) - 8;
        if (local_1130 != 0) {
          uVar33 = uVar33 & 0xfffffffffffffff0;
          local_1170 = context->scene;
          lVar27 = 0;
          do {
            lVar26 = lVar27 * 0x50;
            pGVar3 = (local_1170->geometries).items[*(uint *)(uVar33 + 0x30 + lVar26)].ptr;
            fVar79 = (pGVar3->time_range).lower;
            fVar79 = pGVar3->fnumTimeSegments *
                     (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar79) /
                     ((pGVar3->time_range).upper - fVar79));
            auVar47 = vroundss_avx(ZEXT416((uint)fVar79),ZEXT416((uint)fVar79),9);
            auVar47 = vminss_avx(auVar47,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
            auVar54 = vmaxss_avx512f(auVar92._0_16_,auVar47);
            lVar38 = (long)(int)auVar54._0_4_ * 0x38;
            lVar36 = *(long *)(*(long *)&pGVar3[2].numPrimitives + lVar38);
            auVar47 = *(undefined1 (*) [16])(lVar36 + (ulong)*(uint *)(uVar33 + lVar26) * 4);
            uVar25 = (ulong)*(uint *)(uVar33 + 0x10 + lVar26);
            auVar48 = *(undefined1 (*) [16])(lVar36 + uVar25 * 4);
            uVar28 = (ulong)*(uint *)(uVar33 + 0x20 + lVar26);
            auVar44 = *(undefined1 (*) [16])(lVar36 + uVar28 * 4);
            uVar31 = (ulong)*(uint *)(uVar33 + 4 + lVar26);
            auVar45 = *(undefined1 (*) [16])(lVar36 + uVar31 * 4);
            uVar32 = (ulong)*(uint *)(uVar33 + 0x14 + lVar26);
            auVar46 = *(undefined1 (*) [16])(lVar36 + uVar32 * 4);
            uVar34 = (ulong)*(uint *)(uVar33 + 0x24 + lVar26);
            auVar68 = *(undefined1 (*) [16])(lVar36 + uVar34 * 4);
            uVar35 = (ulong)*(uint *)(uVar33 + 8 + lVar26);
            auVar55 = *(undefined1 (*) [16])(lVar36 + uVar35 * 4);
            uVar37 = (ulong)*(uint *)(uVar33 + 0x18 + lVar26);
            auVar57 = *(undefined1 (*) [16])(lVar36 + uVar37 * 4);
            uVar30 = (ulong)*(uint *)(uVar33 + 0x28 + lVar26);
            auVar66 = *(undefined1 (*) [16])(lVar36 + uVar30 * 4);
            uVar43 = (ulong)*(uint *)(uVar33 + 0xc + lVar26);
            auVar67 = *(undefined1 (*) [16])(lVar36 + uVar43 * 4);
            uVar41 = (ulong)*(uint *)(uVar33 + 0x1c + lVar26);
            auVar65 = *(undefined1 (*) [16])(lVar36 + uVar41 * 4);
            lVar38 = *(long *)(*(long *)&pGVar3[2].numPrimitives + 0x38 + lVar38);
            uVar39 = (ulong)*(uint *)(uVar33 + 0x2c + lVar26);
            auVar56 = *(undefined1 (*) [16])(lVar36 + uVar39 * 4);
            auVar58 = *(undefined1 (*) [16])(lVar38 + (ulong)*(uint *)(uVar33 + lVar26) * 4);
            auVar59 = *(undefined1 (*) [16])(lVar38 + uVar25 * 4);
            auVar62 = *(undefined1 (*) [16])(lVar38 + uVar28 * 4);
            auVar60 = *(undefined1 (*) [16])(lVar38 + uVar31 * 4);
            auVar61 = *(undefined1 (*) [16])(lVar38 + uVar32 * 4);
            auVar63 = *(undefined1 (*) [16])(lVar38 + uVar34 * 4);
            auVar64 = *(undefined1 (*) [16])(lVar38 + uVar35 * 4);
            auVar85 = *(undefined1 (*) [16])(lVar38 + uVar37 * 4);
            auVar49 = *(undefined1 (*) [16])(lVar38 + uVar30 * 4);
            auVar50 = *(undefined1 (*) [16])(lVar38 + uVar43 * 4);
            auVar51 = *(undefined1 (*) [16])(lVar38 + uVar41 * 4);
            auVar52 = *(undefined1 (*) [16])(lVar38 + uVar39 * 4);
            puVar1 = (undefined8 *)(uVar33 + 0x30 + lVar26);
            local_f88 = *puVar1;
            uStack_f80 = puVar1[1];
            puVar1 = (undefined8 *)(uVar33 + 0x40 + lVar26);
            auVar53 = vunpcklps_avx(auVar47,auVar55);
            auVar47 = vunpckhps_avx(auVar47,auVar55);
            auVar55 = vunpcklps_avx(auVar45,auVar67);
            auVar45 = vunpckhps_avx(auVar45,auVar67);
            auVar67 = vunpcklps_avx(auVar47,auVar45);
            auVar8 = vunpcklps_avx(auVar53,auVar55);
            auVar47 = vunpckhps_avx(auVar53,auVar55);
            auVar55 = vunpcklps_avx(auVar48,auVar57);
            auVar48 = vunpckhps_avx(auVar48,auVar57);
            auVar57 = vunpcklps_avx(auVar46,auVar65);
            auVar45 = vunpckhps_avx(auVar46,auVar65);
            auVar46 = vunpcklps_avx(auVar48,auVar45);
            auVar65 = vunpcklps_avx(auVar55,auVar57);
            auVar48 = vunpckhps_avx(auVar55,auVar57);
            auVar55 = vunpcklps_avx(auVar44,auVar66);
            auVar44 = vunpckhps_avx(auVar44,auVar66);
            auVar57 = vunpcklps_avx(auVar68,auVar56);
            auVar45 = vunpckhps_avx(auVar68,auVar56);
            auVar68 = vunpcklps_avx(auVar44,auVar45);
            auVar66 = vunpcklps_avx(auVar55,auVar57);
            auVar44 = vunpckhps_avx(auVar55,auVar57);
            auVar45 = vunpcklps_avx512vl(auVar58,auVar64);
            auVar55 = vunpckhps_avx512vl(auVar58,auVar64);
            auVar56 = vunpcklps_avx512vl(auVar60,auVar50);
            auVar57 = vunpckhps_avx512vl(auVar60,auVar50);
            auVar55 = vunpcklps_avx(auVar55,auVar57);
            auVar57 = vunpcklps_avx(auVar45,auVar56);
            auVar45 = vunpckhps_avx(auVar45,auVar56);
            auVar56 = vunpcklps_avx512vl(auVar59,auVar85);
            auVar58 = vunpckhps_avx512vl(auVar59,auVar85);
            auVar59 = vunpcklps_avx512vl(auVar61,auVar51);
            auVar60 = vunpckhps_avx512vl(auVar61,auVar51);
            auVar58 = vunpcklps_avx512vl(auVar58,auVar60);
            auVar60 = vunpcklps_avx512vl(auVar56,auVar59);
            auVar59 = vunpckhps_avx512vl(auVar56,auVar59);
            auVar61 = vunpcklps_avx512vl(auVar62,auVar49);
            auVar56 = vunpckhps_avx512vl(auVar62,auVar49);
            auVar62 = vunpcklps_avx512vl(auVar63,auVar52);
            auVar63 = vunpckhps_avx512vl(auVar63,auVar52);
            auVar56 = vunpcklps_avx(auVar56,auVar63);
            auVar63 = vunpcklps_avx512vl(auVar61,auVar62);
            auVar62 = vunpckhps_avx512vl(auVar61,auVar62);
            auVar64 = ZEXT416((uint)(fVar79 - auVar54._0_4_));
            auVar61 = vbroadcastss_avx512vl(auVar64);
            auVar64 = vsubss_avx512f(ZEXT416(0x3f800000),auVar64);
            auVar71._0_4_ = auVar64._0_4_;
            auVar71._4_4_ = auVar71._0_4_;
            auVar71._8_4_ = auVar71._0_4_;
            auVar71._12_4_ = auVar71._0_4_;
            auVar57 = vmulps_avx512vl(auVar61,auVar57);
            auVar45 = vmulps_avx512vl(auVar61,auVar45);
            auVar64 = vmulps_avx512vl(auVar61,auVar55);
            auVar55 = vfmadd231ps_fma(auVar57,auVar71,auVar8);
            auVar57 = vfmadd231ps_fma(auVar45,auVar71,auVar47);
            auVar67 = vfmadd231ps_fma(auVar64,auVar71,auVar67);
            auVar47 = vmulps_avx512vl(auVar61,auVar60);
            auVar45 = vmulps_avx512vl(auVar61,auVar59);
            auVar58 = vmulps_avx512vl(auVar61,auVar58);
            auVar47 = vfmadd231ps_fma(auVar47,auVar71,auVar65);
            auVar48 = vfmadd231ps_fma(auVar45,auVar71,auVar48);
            auVar45 = vfmadd231ps_fma(auVar58,auVar71,auVar46);
            auVar46 = vmulps_avx512vl(auVar61,auVar63);
            auVar65 = vmulps_avx512vl(auVar61,auVar62);
            auVar56 = vmulps_avx512vl(auVar61,auVar56);
            auVar46 = vfmadd231ps_fma(auVar46,auVar71,auVar66);
            auVar66 = vfmadd231ps_fma(auVar65,auVar71,auVar44);
            auVar68 = vfmadd231ps_fma(auVar56,auVar71,auVar68);
            local_10c8 = *puVar1;
            uStack_10c0 = puVar1[1];
            auVar47 = vsubps_avx(auVar55,auVar47);
            auVar48 = vsubps_avx(auVar57,auVar48);
            auVar44 = vsubps_avx(auVar67,auVar45);
            auVar45 = vsubps_avx(auVar46,auVar55);
            auVar46 = vsubps_avx(auVar66,auVar57);
            auVar68 = vsubps_avx(auVar68,auVar67);
            auVar72._0_4_ = auVar48._0_4_ * auVar68._0_4_;
            auVar72._4_4_ = auVar48._4_4_ * auVar68._4_4_;
            auVar72._8_4_ = auVar48._8_4_ * auVar68._8_4_;
            auVar72._12_4_ = auVar48._12_4_ * auVar68._12_4_;
            local_1038 = vfmsub231ps_fma(auVar72,auVar46,auVar44);
            auVar76._0_4_ = auVar44._0_4_ * auVar45._0_4_;
            auVar76._4_4_ = auVar44._4_4_ * auVar45._4_4_;
            auVar76._8_4_ = auVar44._8_4_ * auVar45._8_4_;
            auVar76._12_4_ = auVar44._12_4_ * auVar45._12_4_;
            local_1028 = vfmsub231ps_fma(auVar76,auVar68,auVar47);
            auVar78._0_4_ = auVar47._0_4_ * auVar46._0_4_;
            auVar78._4_4_ = auVar47._4_4_ * auVar46._4_4_;
            auVar78._8_4_ = auVar47._8_4_ * auVar46._8_4_;
            auVar78._12_4_ = auVar47._12_4_ * auVar46._12_4_;
            fVar79 = (ray->super_RayK<1>).dir.field_0.m128[0];
            auVar80._4_4_ = fVar79;
            auVar80._0_4_ = fVar79;
            auVar80._8_4_ = fVar79;
            auVar80._12_4_ = fVar79;
            auVar66 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[1]))
            ;
            auVar65 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[2]))
            ;
            uVar77 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar8._4_4_ = uVar77;
            auVar8._0_4_ = uVar77;
            auVar8._8_4_ = uVar77;
            auVar8._12_4_ = uVar77;
            auVar56 = vsubps_avx512vl(auVar55,auVar8);
            local_1018 = vfmsub231ps_fma(auVar78,auVar45,auVar48);
            uVar77 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar54._4_4_ = uVar77;
            auVar54._0_4_ = uVar77;
            auVar54._8_4_ = uVar77;
            auVar54._12_4_ = uVar77;
            auVar57 = vsubps_avx512vl(auVar57,auVar54);
            uVar77 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar15._4_4_ = uVar77;
            auVar15._0_4_ = uVar77;
            auVar15._8_4_ = uVar77;
            auVar15._12_4_ = uVar77;
            auVar67 = vsubps_avx512vl(auVar67,auVar15);
            auVar55 = vmulps_avx512vl(auVar66,auVar67);
            auVar58 = vfmsub231ps_avx512vl(auVar55,auVar57,auVar65);
            auVar55 = vmulps_avx512vl(auVar65,auVar56);
            auVar55 = vfmsub231ps_fma(auVar55,auVar67,auVar80);
            auVar91._0_4_ = fVar79 * auVar57._0_4_;
            auVar91._4_4_ = fVar79 * auVar57._4_4_;
            auVar91._8_4_ = fVar79 * auVar57._8_4_;
            auVar91._12_4_ = fVar79 * auVar57._12_4_;
            auVar59 = vfmsub231ps_avx512vl(auVar91,auVar56,auVar66);
            auVar65 = vmulps_avx512vl(local_1018,auVar65);
            auVar66 = vfmadd231ps_avx512vl(auVar65,local_1028,auVar66);
            auVar66 = vfmadd231ps_avx512vl(auVar66,local_1038,auVar80);
            auVar16._8_4_ = 0x7fffffff;
            auVar16._0_8_ = 0x7fffffff7fffffff;
            auVar16._12_4_ = 0x7fffffff;
            local_1088 = vandps_avx512vl(auVar66,auVar16);
            auVar68 = vmulps_avx512vl(auVar68,auVar59);
            auVar46 = vfmadd231ps_avx512vl(auVar68,auVar55,auVar46);
            auVar45 = vfmadd231ps_avx512vl(auVar46,auVar58,auVar45);
            auVar17._8_4_ = 0x80000000;
            auVar17._0_8_ = 0x8000000080000000;
            auVar17._12_4_ = 0x80000000;
            auVar46 = vandpd_avx512vl(auVar66,auVar17);
            local_10b8 = vxorps_avx512vl(auVar46,auVar45);
            auVar90._0_4_ = auVar44._0_4_ * auVar59._0_4_;
            auVar90._4_4_ = auVar44._4_4_ * auVar59._4_4_;
            auVar90._8_4_ = auVar44._8_4_ * auVar59._8_4_;
            auVar90._12_4_ = auVar44._12_4_ * auVar59._12_4_;
            auVar48 = vfmadd231ps_fma(auVar90,auVar48,auVar55);
            auVar47 = vfmadd231ps_fma(auVar48,auVar47,auVar58);
            local_10a8._0_4_ = (float)(auVar46._0_4_ ^ auVar47._0_4_);
            local_10a8._4_4_ = (float)(auVar46._4_4_ ^ auVar47._4_4_);
            local_10a8._8_4_ = (float)(auVar46._8_4_ ^ auVar47._8_4_);
            local_10a8._12_4_ = (float)(auVar46._12_4_ ^ auVar47._12_4_);
            auVar47 = ZEXT816(0) << 0x20;
            uVar9 = vcmpps_avx512vl(local_10b8,auVar47,5);
            uVar10 = vcmpps_avx512vl(local_10a8,auVar47,5);
            uVar11 = vcmpps_avx512vl(auVar66,auVar47,4);
            auVar87._0_4_ = local_10a8._0_4_ + local_10b8._0_4_;
            auVar87._4_4_ = local_10a8._4_4_ + local_10b8._4_4_;
            auVar87._8_4_ = local_10a8._8_4_ + local_10b8._8_4_;
            auVar87._12_4_ = local_10a8._12_4_ + local_10b8._12_4_;
            uVar12 = vcmpps_avx512vl(auVar87,local_1088,2);
            local_1077 = (byte)uVar9 & (byte)uVar10 & (byte)uVar11 & (byte)uVar12;
            if (local_1077 != 0) {
              auVar84._0_4_ = local_1018._0_4_ * auVar67._0_4_;
              auVar84._4_4_ = local_1018._4_4_ * auVar67._4_4_;
              auVar84._8_4_ = local_1018._8_4_ * auVar67._8_4_;
              auVar84._12_4_ = local_1018._12_4_ * auVar67._12_4_;
              auVar47 = vfmadd213ps_fma(auVar57,local_1028,auVar84);
              auVar47 = vfmadd213ps_fma(auVar56,local_1038,auVar47);
              local_1098._0_4_ = (float)(auVar46._0_4_ ^ auVar47._0_4_);
              local_1098._4_4_ = (float)(auVar46._4_4_ ^ auVar47._4_4_);
              local_1098._8_4_ = (float)(auVar46._8_4_ ^ auVar47._8_4_);
              local_1098._12_4_ = (float)(auVar46._12_4_ ^ auVar47._12_4_);
              uVar77 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar18._4_4_ = uVar77;
              auVar18._0_4_ = uVar77;
              auVar18._8_4_ = uVar77;
              auVar18._12_4_ = uVar77;
              auVar47 = vmulps_avx512vl(local_1088,auVar18);
              fVar79 = (ray->super_RayK<1>).tfar;
              auVar19._4_4_ = fVar79;
              auVar19._0_4_ = fVar79;
              auVar19._8_4_ = fVar79;
              auVar19._12_4_ = fVar79;
              auVar48 = vmulps_avx512vl(local_1088,auVar19);
              uVar9 = vcmpps_avx512vl(local_1098,auVar48,2);
              uVar10 = vcmpps_avx512vl(auVar47,local_1098,1);
              local_1077 = (byte)uVar9 & (byte)uVar10 & local_1077;
              uVar25 = (ulong)local_1077;
              if (local_1077 != 0) {
                auVar47 = vrcp14ps_avx512vl(local_1088);
                auVar20._8_4_ = 0x3f800000;
                auVar20._0_8_ = &DAT_3f8000003f800000;
                auVar20._12_4_ = 0x3f800000;
                auVar48 = vfnmadd213ps_avx512vl(local_1088,auVar47,auVar20);
                auVar47 = vfmadd132ps_fma(auVar48,auVar47,auVar47);
                fVar79 = auVar47._0_4_;
                local_1048._0_4_ = fVar79 * local_1098._0_4_;
                fVar81 = auVar47._4_4_;
                local_1048._4_4_ = fVar81 * local_1098._4_4_;
                fVar82 = auVar47._8_4_;
                local_1048._8_4_ = fVar82 * local_1098._8_4_;
                fVar83 = auVar47._12_4_;
                local_1048._12_4_ = fVar83 * local_1098._12_4_;
                auVar75 = ZEXT1664(local_1048);
                local_1068[0] = fVar79 * local_10b8._0_4_;
                local_1068[1] = fVar81 * local_10b8._4_4_;
                local_1068[2] = fVar82 * local_10b8._8_4_;
                local_1068[3] = fVar83 * local_10b8._12_4_;
                local_1058[0] = fVar79 * local_10a8._0_4_;
                local_1058[1] = fVar81 * local_10a8._4_4_;
                local_1058[2] = fVar82 * local_10a8._8_4_;
                local_1058[3] = fVar83 * local_10a8._12_4_;
                auVar73._8_4_ = 0x7f800000;
                auVar73._0_8_ = 0x7f8000007f800000;
                auVar73._12_4_ = 0x7f800000;
                auVar47 = vblendmps_avx512vl(auVar73,local_1048);
                auVar69._0_4_ =
                     (uint)(local_1077 & 1) * auVar47._0_4_ |
                     (uint)!(bool)(local_1077 & 1) * 0x7f800000;
                bVar6 = (bool)(local_1077 >> 1 & 1);
                auVar69._4_4_ = (uint)bVar6 * auVar47._4_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)(local_1077 >> 2 & 1);
                auVar69._8_4_ = (uint)bVar6 * auVar47._8_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)(local_1077 >> 3 & 1);
                auVar69._12_4_ = (uint)bVar6 * auVar47._12_4_ | (uint)!bVar6 * 0x7f800000;
                auVar47 = vshufps_avx(auVar69,auVar69,0xb1);
                auVar47 = vminps_avx(auVar47,auVar69);
                auVar48 = vshufpd_avx(auVar47,auVar47,1);
                auVar47 = vminps_avx(auVar48,auVar47);
                uVar9 = vcmpps_avx512vl(auVar69,auVar47,0);
                bVar23 = (byte)uVar9 & local_1077;
                if (((byte)uVar9 & local_1077) == 0) {
                  bVar23 = local_1077;
                }
                uVar30 = 0;
                for (uVar28 = (ulong)bVar23; (uVar28 & 1) == 0;
                    uVar28 = uVar28 >> 1 | 0x8000000000000000) {
                  uVar30 = uVar30 + 1;
                }
                do {
                  auVar47 = auVar92._0_16_;
                  uVar29 = *(uint *)((long)&local_f88 + uVar30 * 4);
                  pGVar3 = (local_1170->geometries).items[uVar29].ptr;
                  if ((pGVar3->mask & (ray->super_RayK<1>).mask) == 0) {
                    uVar25 = (ulong)(byte)(~(byte)(1 << ((uint)uVar30 & 0x1f)) & (byte)uVar25);
                    bVar6 = true;
                  }
                  else {
                    pRVar4 = context->args;
                    if ((pRVar4->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar6 = false;
                    }
                    else {
                      local_1008 = auVar75._0_16_;
                      local_ff8 = auVar96._0_16_;
                      local_fe8 = auVar95._0_16_;
                      local_fd8 = auVar94._0_16_;
                      local_fc8 = auVar93._0_16_;
                      local_1128.context = context->user;
                      local_10f8 = *(float *)(local_1038 + uVar30 * 4);
                      local_10f4 = *(undefined4 *)(local_1028 + uVar30 * 4);
                      local_10f0 = *(undefined4 *)(local_1018 + uVar30 * 4);
                      local_10ec = local_1068[uVar30];
                      local_10e8 = local_1058[uVar30];
                      local_10e4 = *(undefined4 *)((long)&local_10c8 + uVar30 * 4);
                      local_10e0 = uVar29;
                      local_10dc = (local_1128.context)->instID[0];
                      local_10d8 = (local_1128.context)->instPrimID[0];
                      fVar79 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_1048 + uVar30 * 4);
                      local_1174 = -1;
                      local_1128.valid = &local_1174;
                      local_1128.geometryUserPtr = pGVar3->userPtr;
                      local_1128.ray = (RTCRayN *)ray;
                      local_1128.hit = (RTCHitN *)&local_10f8;
                      local_1128.N = 1;
                      if ((pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*pGVar3->intersectionFilterN)(&local_1128), *local_1128.valid != 0)) {
                        if (pRVar4->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar4->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar3->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar4->filter)(&local_1128);
                          }
                          if (*local_1128.valid == 0) goto LAB_01f47e45;
                        }
                        (((Vec3f *)((long)local_1128.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_1128.hit;
                        (((Vec3f *)((long)local_1128.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_1128.hit + 4);
                        (((Vec3f *)((long)local_1128.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_1128.hit + 8);
                        *(float *)((long)local_1128.ray + 0x3c) = *(float *)(local_1128.hit + 0xc);
                        *(float *)((long)local_1128.ray + 0x40) = *(float *)(local_1128.hit + 0x10);
                        *(float *)((long)local_1128.ray + 0x44) = *(float *)(local_1128.hit + 0x14);
                        *(float *)((long)local_1128.ray + 0x48) = *(float *)(local_1128.hit + 0x18);
                        *(float *)((long)local_1128.ray + 0x4c) = *(float *)(local_1128.hit + 0x1c);
                        *(float *)((long)local_1128.ray + 0x50) = *(float *)(local_1128.hit + 0x20);
                      }
                      else {
LAB_01f47e45:
                        (ray->super_RayK<1>).tfar = fVar79;
                      }
                      auVar75 = ZEXT1664(local_1008);
                      fVar79 = (ray->super_RayK<1>).tfar;
                      auVar21._4_4_ = fVar79;
                      auVar21._0_4_ = fVar79;
                      auVar21._8_4_ = fVar79;
                      auVar21._12_4_ = fVar79;
                      uVar9 = vcmpps_avx512vl(local_1008,auVar21,2);
                      uVar25 = (ulong)(byte)(~(byte)(1 << ((uint)uVar30 & 0x1f)) & (byte)uVar25 &
                                            (byte)uVar9);
                      bVar6 = true;
                      auVar47 = vxorps_avx512vl(auVar47,auVar47);
                      auVar92 = ZEXT1664(auVar47);
                      auVar93 = ZEXT1664(local_fc8);
                      auVar94 = ZEXT1664(local_fd8);
                      auVar95 = ZEXT1664(local_fe8);
                      auVar96 = ZEXT1664(local_ff8);
                    }
                  }
                  if (!bVar6) {
                    fVar79 = local_1068[uVar30];
                    fVar81 = local_1058[uVar30];
                    (ray->super_RayK<1>).tfar = *(float *)(local_1048 + uVar30 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_1038 + uVar30 * 4);
                    (ray->Ng).field_0.field_0.y = *(float *)(local_1028 + uVar30 * 4);
                    (ray->Ng).field_0.field_0.z = *(float *)(local_1018 + uVar30 * 4);
                    ray->u = fVar79;
                    ray->v = fVar81;
                    ray->primID = *(uint *)((long)&local_10c8 + uVar30 * 4);
                    ray->geomID = uVar29;
                    pRVar5 = context->user;
                    ray->instID[0] = pRVar5->instID[0];
                    ray->instPrimID[0] = pRVar5->instPrimID[0];
                    break;
                  }
                  bVar23 = (byte)uVar25;
                  if (bVar23 == 0) break;
                  auVar74._8_4_ = 0x7f800000;
                  auVar74._0_8_ = 0x7f8000007f800000;
                  auVar74._12_4_ = 0x7f800000;
                  auVar47 = vblendmps_avx512vl(auVar74,auVar75._0_16_);
                  auVar70._0_4_ =
                       (uint)(bVar23 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar23 & 1) * 0x7f800000;
                  bVar6 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar70._4_4_ = (uint)bVar6 * auVar47._4_4_ | (uint)!bVar6 * 0x7f800000;
                  bVar6 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar70._8_4_ = (uint)bVar6 * auVar47._8_4_ | (uint)!bVar6 * 0x7f800000;
                  bVar6 = (bool)((byte)(uVar25 >> 3) & 1);
                  auVar70._12_4_ = (uint)bVar6 * auVar47._12_4_ | (uint)!bVar6 * 0x7f800000;
                  auVar47 = vshufps_avx(auVar70,auVar70,0xb1);
                  auVar47 = vminps_avx(auVar47,auVar70);
                  auVar48 = vshufpd_avx(auVar47,auVar47,1);
                  auVar47 = vminps_avx(auVar48,auVar47);
                  uVar9 = vcmpps_avx512vl(auVar70,auVar47,0);
                  bVar23 = (byte)uVar9 & bVar23;
                  uVar29 = (uint)uVar25;
                  if (bVar23 != 0) {
                    uVar29 = (uint)bVar23;
                  }
                  uVar13 = 0;
                  for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x80000000) {
                    uVar13 = uVar13 + 1;
                  }
                  uVar30 = (ulong)uVar13;
                } while( true );
              }
            }
            lVar27 = lVar27 + 1;
          } while (lVar27 != local_1130);
        }
        fVar79 = (ray->super_RayK<1>).tfar;
        auVar75 = ZEXT1664(CONCAT412(fVar79,CONCAT48(fVar79,CONCAT44(fVar79,fVar79))));
        auVar86 = ZEXT1664(local_f98);
        auVar88 = ZEXT1664(local_fa8);
        auVar89 = ZEXT1664(local_fb8);
        lVar27 = local_1148;
        lVar36 = local_1140;
        lVar38 = local_1160;
        lVar26 = local_1168;
        lVar40 = local_1150;
        lVar42 = local_1158;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }